

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

void __thiscall subprocess::detail::Streams::cleanup_fds(Streams *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(in_RDI + 0x30) != -1) && (*(int *)(in_RDI + 0x34) != -1)) {
    close(*(int *)(in_RDI + 0x30));
  }
  if ((*(int *)(in_RDI + 0x38) != -1) && (*(int *)(in_RDI + 0x3c) != -1)) {
    close(*(int *)(in_RDI + 0x3c));
  }
  if ((*(int *)(in_RDI + 0x40) != -1) && (*(int *)(in_RDI + 0x44) != -1)) {
    close(*(int *)(in_RDI + 0x44));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void cleanup_fds()
  {
    if (write_to_child_ != -1 && read_from_parent_ != -1) {
      close(write_to_child_);
    }
    if (write_to_parent_ != -1 && read_from_child_ != -1) {
      close(read_from_child_);
    }
    if (err_write_ != -1 && err_read_ != -1) {
      close(err_read_);
    }
  }